

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

ColumnBinding duckdb::ColumnBinding::Deserialize(Deserializer *deserializer)

{
  ColumnBinding CVar1;
  ColumnBinding result;
  
  result.table_index._0_4_ = 0xffffffff;
  result.table_index._4_4_ = 0xffffffff;
  result.column_index._0_4_ = 0xffffffff;
  result.column_index._4_4_ = 0xffffffff;
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,100,"table_index",&result.table_index);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0x65,"column_index",&result.column_index);
  CVar1.table_index._4_4_ = result.table_index._4_4_;
  CVar1.table_index._0_4_ = (undefined4)result.table_index;
  CVar1.column_index._0_4_ = (undefined4)result.column_index;
  CVar1.column_index._4_4_ = result.column_index._4_4_;
  return CVar1;
}

Assistant:

ColumnBinding ColumnBinding::Deserialize(Deserializer &deserializer) {
	ColumnBinding result;
	deserializer.ReadPropertyWithDefault<idx_t>(100, "table_index", result.table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(101, "column_index", result.column_index);
	return result;
}